

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_unique.h
# Opt level: O0

unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> __thiscall
spvtools::
MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,unsigned_int&,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
          (spvtools *this,IRContext **args,Op *args_1,uint *args_2,uint *args_3,
          initializer_list<spvtools::opt::Operand> *args_4)

{
  Op op;
  uint32_t ty_id;
  uint32_t res_id;
  IRContext *c;
  initializer_list<spvtools::opt::Operand> __l;
  Instruction *this_00;
  allocator<spvtools::opt::Operand> local_61;
  iterator local_60;
  size_type local_58;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_50;
  initializer_list<spvtools::opt::Operand> *local_38;
  initializer_list<spvtools::opt::Operand> *args_local_4;
  uint *args_local_3;
  uint *args_local_2;
  Op *args_local_1;
  IRContext **args_local;
  
  local_38 = args_4;
  args_local_4 = (initializer_list<spvtools::opt::Operand> *)args_3;
  args_local_3 = args_2;
  args_local_2 = args_1;
  args_local_1 = (Op *)args;
  args_local = (IRContext **)this;
  this_00 = (Instruction *)::operator_new(0x70);
  c = *(IRContext **)args_local_1;
  op = *args_local_2;
  ty_id = *args_local_3;
  res_id = *(uint32_t *)&args_local_4->_M_array;
  local_60 = local_38->_M_array;
  local_58 = local_38->_M_len;
  std::allocator<spvtools::opt::Operand>::allocator(&local_61);
  __l._M_len = local_58;
  __l._M_array = local_60;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            (&local_50,__l,&local_61);
  opt::Instruction::Instruction(this_00,c,op,ty_id,res_id,&local_50);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)this,this_00);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_50);
  std::allocator<spvtools::opt::Operand>::~allocator(&local_61);
  return (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}